

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_GetRootPropertyForTypeOf<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  InlineCacheIndex inlineCacheIndex;
  PropertyId propertyId_00;
  Var pvVar1;
  FunctionBody *functionBody;
  InlineCache *inlineCache;
  DynamicObject *object;
  Var value;
  PropertyId propertyId;
  Var rootInstance;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pvVar1 = GetRootObject(this);
  propertyId_00 = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  functionBody = GetFunctionBody(this);
  inlineCache = GetInlineCache(this,playout->inlineCacheIndex);
  inlineCacheIndex = playout->inlineCacheIndex;
  object = UnsafeVarTo<Js::DynamicObject>(pvVar1);
  pvVar1 = Js::JavascriptOperators::PatchGetRootValueForTypeOf<false,Js::InlineCache>
                     (functionBody,inlineCache,inlineCacheIndex,object,propertyId_00);
  SetReg<unsigned_int>(this,playout->Value,pvVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetRootPropertyForTypeOf(unaligned T* playout)
    {
        Var rootInstance = GetRootObject();
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);

        Var value = JavascriptOperators::PatchGetRootValueForTypeOf<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            UnsafeVarTo<DynamicObject>(rootInstance),
            propertyId
            );

        SetReg(playout->Value, value);

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetRootValue throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(rootInstance, propertyId, value, /*successful:*/true);
        }
#endif
    }